

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgfmt.cpp
# Opt level: O2

void __thiscall icu_63::MessageFormat::setFormat(MessageFormat *this,int32_t n,Format *newFormat)

{
  int32_t partIndex;
  undefined8 in_RAX;
  undefined4 extraout_var;
  int iVar1;
  UErrorCode status;
  undefined8 uStack_28;
  
  if (-1 < n) {
    iVar1 = n + 1;
    partIndex = 0;
    uStack_28 = in_RAX;
    do {
      partIndex = nextTopLevelArgStart(this,partIndex);
      if (partIndex < 0) {
        return;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    iVar1 = (*(newFormat->super_UObject)._vptr_UObject[4])(newFormat);
    if ((Format *)CONCAT44(extraout_var,iVar1) != (Format *)0x0) {
      uStack_28 = (ulong)(uint)uStack_28;
      setCustomArgStartFormat
                (this,partIndex,(Format *)CONCAT44(extraout_var,iVar1),
                 (UErrorCode *)((long)&uStack_28 + 4));
    }
  }
  return;
}

Assistant:

void
MessageFormat::setFormat(int32_t n, const Format& newFormat) {

    if (n >= 0) {
        int32_t formatNumber = 0;
        for (int32_t partIndex = 0;
             (partIndex = nextTopLevelArgStart(partIndex)) >= 0;) {
            if (n == formatNumber) {
                Format* new_format = newFormat.clone();
                if (new_format) {
                    UErrorCode status = U_ZERO_ERROR;
                    setCustomArgStartFormat(partIndex, new_format, status);
                }
                return;
            }
            ++formatNumber;
        }
    }
}